

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_NV_bindless_texture(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_NV_bindless_texture != 0) {
    glad_glGetTextureHandleNV = (PFNGLGETTEXTUREHANDLENVPROC)(*in_RDI)("glGetTextureHandleNV");
    glad_glGetTextureSamplerHandleNV =
         (PFNGLGETTEXTURESAMPLERHANDLENVPROC)(*in_RDI)("glGetTextureSamplerHandleNV");
    glad_glMakeTextureHandleResidentNV =
         (PFNGLMAKETEXTUREHANDLERESIDENTNVPROC)(*in_RDI)("glMakeTextureHandleResidentNV");
    glad_glMakeTextureHandleNonResidentNV =
         (PFNGLMAKETEXTUREHANDLENONRESIDENTNVPROC)(*in_RDI)("glMakeTextureHandleNonResidentNV");
    glad_glGetImageHandleNV = (PFNGLGETIMAGEHANDLENVPROC)(*in_RDI)("glGetImageHandleNV");
    glad_glMakeImageHandleResidentNV =
         (PFNGLMAKEIMAGEHANDLERESIDENTNVPROC)(*in_RDI)("glMakeImageHandleResidentNV");
    glad_glMakeImageHandleNonResidentNV =
         (PFNGLMAKEIMAGEHANDLENONRESIDENTNVPROC)(*in_RDI)("glMakeImageHandleNonResidentNV");
    glad_glUniformHandleui64NV = (PFNGLUNIFORMHANDLEUI64NVPROC)(*in_RDI)("glUniformHandleui64NV");
    glad_glUniformHandleui64vNV = (PFNGLUNIFORMHANDLEUI64VNVPROC)(*in_RDI)("glUniformHandleui64vNV")
    ;
    glad_glProgramUniformHandleui64NV =
         (PFNGLPROGRAMUNIFORMHANDLEUI64NVPROC)(*in_RDI)("glProgramUniformHandleui64NV");
    glad_glProgramUniformHandleui64vNV =
         (PFNGLPROGRAMUNIFORMHANDLEUI64VNVPROC)(*in_RDI)("glProgramUniformHandleui64vNV");
    glad_glIsTextureHandleResidentNV =
         (PFNGLISTEXTUREHANDLERESIDENTNVPROC)(*in_RDI)("glIsTextureHandleResidentNV");
    glad_glIsImageHandleResidentNV =
         (PFNGLISIMAGEHANDLERESIDENTNVPROC)(*in_RDI)("glIsImageHandleResidentNV");
  }
  return;
}

Assistant:

static void load_GL_NV_bindless_texture(GLADloadproc load) {
	if(!GLAD_GL_NV_bindless_texture) return;
	glad_glGetTextureHandleNV = (PFNGLGETTEXTUREHANDLENVPROC)load("glGetTextureHandleNV");
	glad_glGetTextureSamplerHandleNV = (PFNGLGETTEXTURESAMPLERHANDLENVPROC)load("glGetTextureSamplerHandleNV");
	glad_glMakeTextureHandleResidentNV = (PFNGLMAKETEXTUREHANDLERESIDENTNVPROC)load("glMakeTextureHandleResidentNV");
	glad_glMakeTextureHandleNonResidentNV = (PFNGLMAKETEXTUREHANDLENONRESIDENTNVPROC)load("glMakeTextureHandleNonResidentNV");
	glad_glGetImageHandleNV = (PFNGLGETIMAGEHANDLENVPROC)load("glGetImageHandleNV");
	glad_glMakeImageHandleResidentNV = (PFNGLMAKEIMAGEHANDLERESIDENTNVPROC)load("glMakeImageHandleResidentNV");
	glad_glMakeImageHandleNonResidentNV = (PFNGLMAKEIMAGEHANDLENONRESIDENTNVPROC)load("glMakeImageHandleNonResidentNV");
	glad_glUniformHandleui64NV = (PFNGLUNIFORMHANDLEUI64NVPROC)load("glUniformHandleui64NV");
	glad_glUniformHandleui64vNV = (PFNGLUNIFORMHANDLEUI64VNVPROC)load("glUniformHandleui64vNV");
	glad_glProgramUniformHandleui64NV = (PFNGLPROGRAMUNIFORMHANDLEUI64NVPROC)load("glProgramUniformHandleui64NV");
	glad_glProgramUniformHandleui64vNV = (PFNGLPROGRAMUNIFORMHANDLEUI64VNVPROC)load("glProgramUniformHandleui64vNV");
	glad_glIsTextureHandleResidentNV = (PFNGLISTEXTUREHANDLERESIDENTNVPROC)load("glIsTextureHandleResidentNV");
	glad_glIsImageHandleResidentNV = (PFNGLISIMAGEHANDLERESIDENTNVPROC)load("glIsImageHandleResidentNV");
}